

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

SceneObject * __thiscall
CMU462::DynamicScene::Mesh::get_transformed_static_object(Mesh *this,double t)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  Mesh *this_00;
  pointer pVVar6;
  _List_node_base *p_Var7;
  int i;
  int i_00;
  long lVar8;
  int j;
  int j_00;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  Vector3D rotate;
  Vector3D position;
  _List_node_base *local_440;
  undefined8 uStack_438;
  _List_node_base *local_430;
  Vector4D local_428;
  Vector3D scale;
  Matrix4x4 local_3e8;
  Vector3D local_368;
  Matrix4x4 R_homogeneous;
  Matrix3x3 R;
  Matrix3x3 Rz;
  Matrix3x3 Ry;
  Matrix3x3 Rx;
  Matrix4x4 S;
  Matrix4x4 transform;
  Matrix4x4 T;
  
  originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Spline<CMU462::Vector3D>::operator()(&position,&(this->super_SceneObject).positions,t);
  Spline<CMU462::Vector3D>::operator()(&rotate,&(this->super_SceneObject).rotations,t);
  Spline<CMU462::Vector3D>::operator()(&scale,&(this->super_SceneObject).scales,t);
  Matrix4x4::identity();
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    dVar3 = *(double *)((long)local_3e8.entries + lVar8 * 8 + -0x18);
    pdVar5 = Matrix4x4::operator()(&S,(int)lVar8,(int)lVar8);
    *pdVar5 = dVar3;
  }
  rotateMatrix(&Rx,1.0,0.0,0.0,(float)rotate.x);
  rotateMatrix(&Ry,0.0,1.0,0.0,(float)rotate.y);
  rotateMatrix(&Rz,0.0,0.0,1.0,(float)rotate.z);
  Matrix3x3::operator*((Matrix3x3 *)&R_homogeneous,&Rx,&Ry);
  Matrix3x3::operator*(&R,(Matrix3x3 *)&R_homogeneous,&Rz);
  Matrix4x4::identity();
  for (i_00 = 0; i_00 != 3; i_00 = i_00 + 1) {
    for (j_00 = 0; j_00 != 3; j_00 = j_00 + 1) {
      pdVar5 = Matrix3x3::operator()(&R,i_00,j_00);
      dVar3 = *pdVar5;
      pdVar5 = Matrix4x4::operator()(&R_homogeneous,i_00,j_00);
      *pdVar5 = dVar3;
    }
  }
  local_368.x = position.x;
  local_368.y = position.y;
  local_368.z = position.z;
  Matrix4x4::translation(&local_368);
  Matrix4x4::operator*(&local_3e8,&T,&R_homogeneous);
  Matrix4x4::operator*(&transform,&local_3e8,&S);
  plVar1 = &(this->mesh).vertices;
  p_Var7 = (_List_node_base *)plVar1;
  while (p_Var7 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var7->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var7 != (_List_node_base *)plVar1) {
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
              (&originalPositions,(value_type *)&p_Var7[1]._M_prev);
    fVar2 = *(float *)((long)&p_Var7[6]._M_prev + 4);
    Vertex::normal((Vector3D *)&local_428,(Vertex *)(p_Var7 + 1));
    dVar3 = (double)fVar2;
    local_3e8.entries[0].z = local_428.z * dVar3 + (double)p_Var7[2]._M_prev;
    dVar4 = (double)p_Var7[2]._M_next + dVar3 * local_428.y;
    local_3e8.entries[0].y._0_4_ = SUB84(dVar4,0);
    local_3e8.entries[0].x = (double)p_Var7[1]._M_prev + dVar3 * local_428.x;
    local_3e8.entries[0].y._4_4_ = (int)((ulong)dVar4 >> 0x20);
    local_3e8.entries[0].w = 1.0;
    Matrix4x4::operator*(&transform,local_3e8.entries);
    Vector4D::to3D(&local_428);
    p_Var7[2]._M_prev = local_430;
    p_Var7[1]._M_prev = local_440;
    p_Var7[2]._M_next = (_List_node_base *)uStack_438;
  }
  this_00 = (Mesh *)operator_new(0x38);
  StaticScene::Mesh::Mesh(this_00,&this->mesh,this->bsdf);
  pVVar6 = originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var7 = (_List_node_base *)plVar1;
  while (p_Var7 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var7->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var7 != (_List_node_base *)plVar1) {
    p_Var7[2]._M_prev = (_List_node_base *)pVVar6->z;
    dVar3 = pVVar6->y;
    p_Var7[1]._M_prev = (_List_node_base *)pVVar6->x;
    p_Var7[2]._M_next = (_List_node_base *)dVar3;
    pVVar6 = pVVar6 + 1;
  }
  std::_Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~_Vector_base
            (&originalPositions.
              super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>);
  return &this_00->super_SceneObject;
}

Assistant:

StaticScene::SceneObject *Mesh::get_transformed_static_object(double t) {
  vector<Vector3D> originalPositions;

  Vector3D position = positions(t);
  Vector3D rotate = rotations(t);
  Vector3D scale = scales(t);

  Matrix4x4 S = Matrix4x4::identity();
  for (int i = 0; i < 3; i++) S(i,i) = scale[i];

  Matrix3x3 Rx = rotateMatrix(1, 0, 0, rotate[0]);
  Matrix3x3 Ry = rotateMatrix(0, 1, 0, rotate[1]);
  Matrix3x3 Rz = rotateMatrix(0, 0, 1, rotate[2]);

  Matrix3x3 R = Rx * Ry * Rz;
  Matrix4x4 R_homogeneous = Matrix4x4::identity();
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 3; j++) {
      R_homogeneous(i,j) = R(i,j);
    }
  }

  Matrix4x4 T = Matrix4x4::translation(position);

  Matrix4x4 transform = T * R_homogeneous * S;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    originalPositions.push_back(v->position);
    Vector4D tmp = Vector4D(v->position + v->offset * v->normal(), 1.0);
    v->position = (transform * tmp).to3D();
  }

  StaticScene::SceneObject *output = new StaticScene::Mesh(mesh, bsdf);

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position = originalPositions[i++];
  }

  return output;
}